

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

void __thiscall
yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonUIntValReq>::_validate
          (JsonIntRangeValReqBase<yactfr::internal::JsonUIntValReq> *this,JsonVal *jsonVal)

{
  pointer puVar1;
  JsonVal *this_00;
  unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
  this_01;
  unsigned_long_long lower;
  ulong uVar2;
  longlong upper;
  ulong upper_00;
  JsonArrayVal *pJVar3;
  JsonUIntVal *pJVar4;
  JsonSIntVal *pJVar5;
  
  JsonArrayValReq::_validate(&this->super_JsonArrayValReq,jsonVal);
  pJVar3 = JsonVal::asArray(jsonVal);
  puVar1 = (pJVar3->super_ArrayItemMixin<yactfr::internal::JsonVal>).
           super_CompoundItemMixin<std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
           ._theItems.
           super__Vector_base<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pJVar3->super_ArrayItemMixin<yactfr::internal::JsonVal>).
      super_CompoundItemMixin<std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
      ._theItems.
      super__Vector_base<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar1) {
    this_00 = (puVar1->_M_t).
              super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
              .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl;
    pJVar3 = JsonVal::asArray(jsonVal);
    puVar1 = (pJVar3->super_ArrayItemMixin<yactfr::internal::JsonVal>).
             super_CompoundItemMixin<std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
             ._theItems.
             super__Vector_base<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(pJVar3->super_ArrayItemMixin<yactfr::internal::JsonVal>).
                          super_CompoundItemMixin<std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
                          ._theItems.
                          super__Vector_base<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
      this_01._M_t.
      super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
      .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl = puVar1[1]._M_t
      ;
      if ((this_00->super_ItemMixin<yactfr::internal::JsonValKind>)._theKind == UInt) {
        pJVar4 = JsonVal::asUInt(this_00);
        lower = (pJVar4->super_ScalarValItemMixin<unsigned_long_long>)._theVal;
        if (((ItemMixin<yactfr::internal::JsonValKind> *)
            ((long)this_01._M_t.
                   super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
                   .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl + 8
            ))->_theKind == UInt) {
          pJVar4 = JsonVal::asUInt((JsonVal *)
                                   this_01._M_t.
                                   super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
                                   .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>.
                                   _M_head_impl);
          uVar2 = (pJVar4->super_ScalarValItemMixin<unsigned_long_long>)._theVal;
          if (uVar2 < lower) {
            _throwLowerGtUpper<unsigned_long_long,unsigned_long_long>(lower,uVar2,&jsonVal->_loc);
          }
        }
        else {
          pJVar5 = JsonVal::asSInt((JsonVal *)
                                   this_01._M_t.
                                   super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
                                   .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>.
                                   _M_head_impl);
          uVar2 = (pJVar5->super_ScalarValItemMixin<long_long>)._theVal;
          if ((long)uVar2 < 0) {
            _throwLowerGtUpper<unsigned_long_long,long_long>(lower,uVar2,&jsonVal->_loc);
          }
          if (uVar2 < lower) {
            _throwLowerGtUpper<unsigned_long_long,long_long>(lower,uVar2,&jsonVal->_loc);
          }
        }
      }
      else {
        pJVar5 = JsonVal::asSInt(this_00);
        uVar2 = (pJVar5->super_ScalarValItemMixin<long_long>)._theVal;
        if (((ItemMixin<yactfr::internal::JsonValKind> *)
            ((long)this_01._M_t.
                   super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
                   .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl + 8
            ))->_theKind == SInt) {
          pJVar5 = JsonVal::asSInt((JsonVal *)
                                   this_01._M_t.
                                   super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
                                   .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>.
                                   _M_head_impl);
          upper = (pJVar5->super_ScalarValItemMixin<long_long>)._theVal;
          if (upper < (long)uVar2) {
            _throwLowerGtUpper<long_long,long_long>(uVar2,upper,&jsonVal->_loc);
          }
        }
        else if (-1 < (long)uVar2) {
          pJVar4 = JsonVal::asUInt((JsonVal *)
                                   this_01._M_t.
                                   super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
                                   .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>.
                                   _M_head_impl);
          upper_00 = (pJVar4->super_ScalarValItemMixin<unsigned_long_long>)._theVal;
          if (upper_00 < uVar2) {
            _throwLowerGtUpper<long_long,unsigned_long_long>(uVar2,upper_00,&jsonVal->_loc);
          }
        }
      }
      return;
    }
  }
  __assert_fail("index < this->_theItems.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/include/yactfr/internal/metadata/item-mixin.hpp"
                ,0x74,
                "const ItemT *yactfr::internal::ArrayItemMixin<yactfr::internal::JsonVal>::_at(const Index) const [ItemT = yactfr::internal::JsonVal]"
               );
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonArrayValReq::_validate(jsonVal);

            /*
             * Here's the truth table:
             *
             * ╔════╦════════════╦════════════╦═══════════════════════════╗
             * ║ ID ║ Lower      ║ Upper      ║ Valid?                    ║
             * ╠════╬════════════╬════════════╬═══════════════════════════╣
             * ║ 1  ║ Unsigned   ║ Unsigned   ║ Lower < upper             ║
             * ║ 2  ║ Signed     ║ Signed     ║ Lower < upper             ║
             * ║ 3  ║ Unsigned   ║ Signed ≥ 0 ║ Lower < upper as unsigned ║
             * ║ 4  ║ Unsigned   ║ Signed < 0 ║ No                        ║
             * ║ 5  ║ Signed ≥ 0 ║ Unsigned   ║ Lower as unsigned < upper ║
             * ║ 6  ║ Signed < 0 ║ Unsigned   ║ Yes                       ║
             * ╚════╩════════════╩════════════╩═══════════════════════════╝
             */
            auto& lowerJsonVal = jsonVal.asArray()[0];
            auto& upperJsonVal = jsonVal.asArray()[1];

            if (lowerJsonVal.isUInt()) {
                const auto uLower = *lowerJsonVal.asUInt();

                if (upperJsonVal.isUInt()) {
                    const auto uUpper = *upperJsonVal.asUInt();

                    if (uUpper < uLower) {
                        // ID 1
                        this->_throwLowerGtUpper(uLower, uUpper, jsonVal.loc());
                    }
                } else {
                    const auto sUpper = *upperJsonVal.asSInt();

                    if (sUpper < 0) {
                        // ID 4
                        this->_throwLowerGtUpper(uLower, sUpper, jsonVal.loc());
                    }

                    if (static_cast<unsigned long long>(sUpper) < uLower) {
                        // ID 3
                        this->_throwLowerGtUpper(uLower, sUpper, jsonVal.loc());
                    }
                }
            } else {
                const auto sLower = *lowerJsonVal.asSInt();

                if (upperJsonVal.isSInt()) {
                    const auto sUpper = *upperJsonVal.asSInt();

                    if (sUpper < sLower) {
                        // ID 2
                        this->_throwLowerGtUpper(sLower, sUpper, jsonVal.loc());
                    }
                } else if (sLower >= 0) {
                    const auto uUpper = *upperJsonVal.asUInt();

                    if (uUpper < static_cast<unsigned long long>(sLower)) {
                        // ID 5
                        this->_throwLowerGtUpper(sLower, uUpper, jsonVal.loc());
                    }
                }
            }
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid integer range:", jsonVal.loc());
            throw;
        }
    }